

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CMU462::Viewer::key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (action == 1) {
    if (key == 0x60) {
      showInfo = showInfo ^ 1;
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
  }
  (**(code **)(*renderer + 0x50))(renderer,key,action,mods & 0xff);
  return;
}

Assistant:

void Viewer::key_callback( GLFWwindow* window, 
                           int key, int scancode, int action, int mods ) {

  if (action == GLFW_PRESS) {
    if( key == GLFW_KEY_ESCAPE ) { 
      glfwSetWindowShouldClose( window, true ); 
    } else if( key == GLFW_KEY_GRAVE_ACCENT ){
      showInfo = !showInfo;
    } 
  }
  
  renderer->keyboard_event( key, action, mods );
}